

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_update_alleles_str(bcf_hdr_t *hdr,bcf1_t *line,char *alleles_string)

{
  int iVar1;
  char *local_48;
  char *t;
  undefined1 auStack_38 [4];
  int nals;
  kstring_t tmp;
  char *alleles_string_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  _auStack_38 = 0;
  tmp.m = (size_t)(line->d).als;
  tmp.l = (size_t)(line->d).m_als;
  tmp.s = alleles_string;
  kputs(alleles_string,(kstring_t *)auStack_38);
  (line->d).als = (char *)tmp.m;
  (line->d).m_als = (int)tmp.l;
  t._4_4_ = 1;
  for (local_48 = (line->d).als; *local_48 != '\0'; local_48 = local_48 + 1) {
    if (*local_48 == ',') {
      *local_48 = '\0';
      t._4_4_ = t._4_4_ + 1;
    }
  }
  iVar1 = _bcf1_sync_alleles(hdr,line,t._4_4_);
  return iVar1;
}

Assistant:

int bcf_update_alleles_str(const bcf_hdr_t *hdr, bcf1_t *line, const char *alleles_string)
{
    kstring_t tmp;
    tmp.l = 0; tmp.s = line->d.als; tmp.m = line->d.m_als;
    kputs(alleles_string, &tmp);
    line->d.als = tmp.s; line->d.m_als = tmp.m;

    int nals = 1;
    char *t = line->d.als;
    while (*t)
    {
        if ( *t==',' ) { *t = 0; nals++; }
        t++;
    }
    return _bcf1_sync_alleles(hdr, line, nals);
}